

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void free_regions(level *lev)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < lev->n_regions; lVar1 = lVar1 + 1) {
    free_region(lev->regions[lVar1]);
  }
  lev->n_regions = 0;
  if (0 < lev->max_regions) {
    free(lev->regions);
  }
  lev->max_regions = 0;
  lev->regions = (region **)0x0;
  return;
}

Assistant:

void free_regions(struct level *lev)
{
    int i;

    for (i = 0; i < lev->n_regions; i++)
	free_region(lev->regions[i]);
    lev->n_regions = 0;
    if (lev->max_regions > 0)
	free(lev->regions);
    lev->max_regions = 0;
    lev->regions = NULL;
}